

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::InitialEntropyCodes<brotli::Histogram<256>,unsigned_char>
               (uchar *data,size_t length,size_t literals_per_histogram,size_t max_histograms,
               size_t stride,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec)

{
  uint uVar1;
  ulong uVar2;
  undefined1 local_470 [8];
  Histogram<256> histo;
  size_t pos;
  size_t i;
  size_t block_length;
  size_t sStack_40;
  uint seed;
  size_t total_histograms;
  vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec_local;
  size_t stride_local;
  size_t max_histograms_local;
  size_t literals_per_histogram_local;
  size_t length_local;
  uchar *data_local;
  
  sStack_40 = length / literals_per_histogram + 1;
  if (max_histograms < sStack_40) {
    sStack_40 = max_histograms;
  }
  block_length._4_4_ = 7;
  uVar2 = length / sStack_40;
  total_histograms = (size_t)vec;
  vec_local = (vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *)stride;
  stride_local = max_histograms;
  max_histograms_local = literals_per_histogram;
  literals_per_histogram_local = length;
  length_local = (size_t)data;
  for (pos = 0; pos < sStack_40; pos = pos + 1) {
    histo.bit_cost_ = (double)((literals_per_histogram_local * pos) / sStack_40);
    if (pos != 0) {
      uVar1 = MyRand((uint *)((long)&block_length + 4));
      histo.bit_cost_ = (double)((ulong)uVar1 % uVar2 + (long)histo.bit_cost_);
    }
    if (literals_per_histogram_local <=
        (ulong)((long)&(vec_local->
                       super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + (long)histo.bit_cost_)) {
      histo.bit_cost_ = (double)((literals_per_histogram_local - (long)vec_local) + -1);
    }
    Histogram<256>::Histogram((Histogram<256> *)local_470);
    Histogram<256>::Add<unsigned_char>
              ((Histogram<256> *)local_470,(uchar *)(length_local + (long)histo.bit_cost_),
               (size_t)vec_local);
    std::vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>::push_back
              ((vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *)
               total_histograms,(value_type *)local_470);
  }
  return;
}

Assistant:

void InitialEntropyCodes(const DataType* data, size_t length,
                         size_t literals_per_histogram,
                         size_t max_histograms,
                         size_t stride,
                         std::vector<HistogramType>* vec) {
  size_t total_histograms = length / literals_per_histogram + 1;
  if (total_histograms > max_histograms) {
    total_histograms = max_histograms;
  }
  unsigned int seed = 7;
  size_t block_length = length / total_histograms;
  for (size_t i = 0; i < total_histograms; ++i) {
    size_t pos = length * i / total_histograms;
    if (i != 0) {
      pos += MyRand(&seed) % block_length;
    }
    if (pos + stride >= length) {
      pos = length - stride - 1;
    }
    HistogramType histo;
    histo.Add(data + pos, stride);
    vec->push_back(histo);
  }
}